

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktx2check.cpp
# Opt level: O0

void __thiscall
ktxValidator::addIssue<char_const*>(ktxValidator *this,severity severity,issue *issue,char *args)

{
  issue *in_RDX;
  long in_RDI;
  char *in_stack_000001c8;
  issue *in_stack_000001d0;
  severity in_stack_000001dc;
  logger *in_stack_000001e0;
  
  ::issue::issue((issue *)(in_RDI + 0x78),in_RDX);
  logger::addIssue<char_const*>
            (in_stack_000001e0,in_stack_000001dc,in_stack_000001d0,in_stack_000001c8);
  ::issue::~issue((issue *)0x11530a);
  return;
}

Assistant:

void addIssue(logger::severity severity, issue issue, Args ... args)
    {
        logger.addIssue(severity, issue, args...);
    }